

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O2

Vec_Ptr_t *
Llb_ImgSupports(Aig_Man_t *p,Vec_Ptr_t *vDdMans,Vec_Int_t *vStart,Vec_Int_t *vStop,int fAddPis,
               int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  DdManager *pDVar5;
  Vec_Ptr_t *p_00;
  Vec_Int_t *pVVar6;
  DdNode *n;
  DdNode *pDVar7;
  void *pvVar8;
  Aig_Obj_t *pObj;
  int Entry;
  int Entry_00;
  int Entry_01;
  int Entry_02;
  int iVar9;
  Vec_Ptr_t *p_01;
  char *__format;
  DdNode *pDVar10;
  uint i;
  
  pDVar5 = (DdManager *)Vec_PtrEntry(vDdMans,0);
  iVar1 = Cudd_ReadSize(pDVar5);
  p_00 = Vec_PtrAlloc(100);
  pVVar6 = Vec_IntStart(iVar1);
  for (iVar9 = 0; iVar9 < vStart->nSize; iVar9 = iVar9 + 1) {
    iVar2 = Vec_IntEntry(vStart,iVar9);
    Vec_IntWriteEntry(pVVar6,iVar2,Entry);
  }
  Vec_PtrPush(p_00,pVVar6);
  for (iVar9 = 0; iVar9 < vDdMans->nSize; iVar9 = iVar9 + 1) {
    pDVar5 = (DdManager *)Vec_PtrEntry(vDdMans,iVar9);
    pVVar6 = Vec_IntStart(iVar1);
    n = Cudd_Support(pDVar5,pDVar5->bFunc);
    Cudd_Ref(n);
    pDVar10 = n;
    while( true ) {
      pDVar7 = Cudd_ReadOne(pDVar5);
      if (pDVar10 == pDVar7) break;
      Vec_IntWriteEntry(pVVar6,pDVar10->index,Entry_00);
      pDVar10 = (pDVar10->type).kids.T;
    }
    Cudd_RecursiveDeref(pDVar5,n);
    Vec_PtrPush(p_00,pVVar6);
  }
  pVVar6 = Vec_IntStart(iVar1);
  for (iVar9 = 0; iVar9 < vStop->nSize; iVar9 = iVar9 + 1) {
    iVar2 = Vec_IntEntry(vStop,iVar9);
    Vec_IntWriteEntry(pVVar6,iVar2,Entry_01);
  }
  if (fAddPis != 0) {
    for (iVar9 = 0; iVar9 < p->nTruePis; iVar9 = iVar9 + 1) {
      pvVar8 = Vec_PtrEntry(p->vCis,iVar9);
      Vec_IntWriteEntry(pVVar6,*(int *)((long)pvVar8 + 0x24),Entry_02);
    }
  }
  Vec_PtrPush(p_00,pVVar6);
  p_01 = p->vObjs;
  if (iVar1 != p_01->nSize) {
    __assert_fail("nSize == Aig_ManObjNumMax(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Image.c"
                  ,0x53,
                  "Vec_Ptr_t *Llb_ImgSupports(Aig_Man_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
                 );
  }
  if (fVerbose != 0) {
    for (i = 0; (int)i < iVar1; i = i + 1) {
      pObj = (Aig_Obj_t *)Vec_PtrEntry(p_01,i);
      if (pObj != (Aig_Obj_t *)0x0) {
        iVar1 = p_00->nSize;
        iVar9 = 0;
        if (iVar1 < 1) {
          iVar1 = 0;
        }
        iVar2 = 0;
        for (; iVar1 != iVar9; iVar9 = iVar9 + 1) {
          pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar9);
          iVar3 = Vec_IntEntry(pVVar6,i);
          iVar2 = iVar2 + iVar3;
        }
        if (iVar2 != 0) {
          printf("Obj = %4d : ",(ulong)i);
          uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
          if ((uVar4 & 7) == 2) {
            iVar9 = Aig_ObjCioId(pObj);
            __format = "pi  ";
            if (p->nTruePis <= iVar9) {
              uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
              goto LAB_0068c56c;
            }
LAB_0068c5ca:
            printf(__format);
          }
          else {
LAB_0068c56c:
            if ((uVar4 & 7) == 2) {
              iVar9 = Aig_ObjCioId(pObj);
              __format = "lo  ";
              if (p->nTruePis <= iVar9) goto LAB_0068c5ca;
              uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
            }
            if ((uVar4 & 7) == 3) {
              iVar9 = Aig_ObjCioId(pObj);
              __format = "li  ";
              if (p->nTruePos <= iVar9) goto LAB_0068c5ca;
              uVar4 = (uint)*(undefined8 *)&pObj->field_0x18;
            }
            __format = "and ";
            if (0xfffffffd < (uVar4 & 7) - 7) goto LAB_0068c5ca;
          }
          for (iVar9 = 0; iVar1 != iVar9; iVar9 = iVar9 + 1) {
            pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar9);
            uVar4 = Vec_IntEntry(pVVar6,i);
            printf("%d",(ulong)uVar4);
          }
          putchar(10);
        }
      }
      p_01 = p->vObjs;
      iVar1 = p_01->nSize;
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Llb_ImgSupports( Aig_Man_t * p, Vec_Ptr_t * vDdMans, Vec_Int_t * vStart, Vec_Int_t * vStop, int fAddPis, int fVerbose )
{
    Vec_Ptr_t * vSupps;
    Vec_Int_t * vOne;
    Aig_Obj_t * pObj;
    DdManager * dd;
    DdNode * bSupp, * bTemp;
    int i, Entry, nSize;
    nSize  = Cudd_ReadSize( (DdManager *)Vec_PtrEntry( vDdMans, 0 ) );
    vSupps = Vec_PtrAlloc( 100 );
    // create initial
    vOne = Vec_IntStart( nSize );
    Vec_IntForEachEntry( vStart, Entry, i )
        Vec_IntWriteEntry( vOne, Entry, 1 );
    Vec_PtrPush( vSupps, vOne );
    // create intermediate 
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        vOne  = Vec_IntStart( nSize );
        bSupp = Cudd_Support( dd, dd->bFunc );  Cudd_Ref( bSupp );
        for ( bTemp = bSupp; bTemp != Cudd_ReadOne(dd); bTemp = cuddT(bTemp) )
            Vec_IntWriteEntry( vOne, bTemp->index, 1 );
        Cudd_RecursiveDeref( dd, bSupp );
        Vec_PtrPush( vSupps, vOne );
    }
    // create final
    vOne = Vec_IntStart( nSize );
    Vec_IntForEachEntry( vStop, Entry, i )
        Vec_IntWriteEntry( vOne, Entry, 1 );
    if ( fAddPis )
        Saig_ManForEachPi( p, pObj, i )
            Vec_IntWriteEntry( vOne, Aig_ObjId(pObj), 1 );
    Vec_PtrPush( vSupps, vOne );

    // print supports
    assert( nSize == Aig_ManObjNumMax(p) );
    if ( !fVerbose )
        return vSupps;
    Aig_ManForEachObj( p, pObj, i )
    {
        int k, Counter = 0;
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            Counter += Vec_IntEntry(vOne, i);
        if ( Counter == 0 ) 
            continue;
        printf( "Obj = %4d : ", i );
        if ( Saig_ObjIsPi(p,pObj) )
            printf( "pi  " );
        else if ( Saig_ObjIsLo(p,pObj) )
            printf( "lo  " );
        else if ( Saig_ObjIsLi(p,pObj) )
            printf( "li  " );
        else if ( Aig_ObjIsNode(pObj) )
            printf( "and " );
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            printf( "%d", Vec_IntEntry(vOne, i) );
        printf( "\n" );
    }
    return vSupps;
}